

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

void __thiscall
TPZTensor<double>::Lodeangle(TPZTensor<double> *this,TPZTensor<double> *GradLode,double *Lode)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double __x;
  double dVar7;
  TPZTensor<double> dJ2t;
  TPZTensor<double> dJ3t;
  TPZTensor<double> dLodeAngle;
  TPZTensor<double> TempTensor;
  TPZTensor<double> local_1a0;
  TPZTensor<double> local_148;
  undefined **local_f0;
  TPZVec<double> local_e8;
  double adStack_c8 [7];
  undefined8 uStack_90;
  undefined **local_88;
  TPZVec<double> local_80;
  double adStack_60 [6];
  
  dVar4 = J2(this);
  dVar5 = J3(this);
  dVar4 = (double)(~-(ulong)(ABS(dVar4) < 1e-06) & (ulong)dVar4 |
                  -(ulong)(ABS(dVar4) < 1e-06) & 0x3eb0c6f7a0b5ed8d);
  if (dVar4 < 0.0) {
    sqrt(dVar4);
  }
  local_1a0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_0189f0b0;
  TPZVec<double>::TPZVec(&local_1a0.fData.super_TPZVec<double>,0);
  local_1a0.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0189f470;
  pdVar1 = local_1a0.fData.fExtAlloc;
  local_1a0.fData.super_TPZVec<double>.fNElements = 6;
  local_1a0.fData.super_TPZVec<double>.fNAlloc = 0;
  local_1a0.fData.fExtAlloc[0] = 0.0;
  local_1a0.fData.fExtAlloc[1] = 0.0;
  local_1a0.fData.fExtAlloc[2] = 0.0;
  local_1a0.fData.fExtAlloc[3] = 0.0;
  local_1a0.fData.fExtAlloc[4] = 0.0;
  local_1a0.fData.fExtAlloc[5] = 0.0;
  local_148.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_0189f0b0;
  local_1a0.fData.super_TPZVec<double>.fStore = pdVar1;
  TPZVec<double>::TPZVec(&local_148.fData.super_TPZVec<double>,0);
  pdVar2 = local_148.fData.fExtAlloc;
  local_148.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0189f470;
  local_148.fData.super_TPZVec<double>.fNElements = 6;
  local_148.fData.super_TPZVec<double>.fNAlloc = 0;
  local_148.fData.fExtAlloc[0] = 0.0;
  local_148.fData.fExtAlloc[1] = 0.0;
  local_148.fData.fExtAlloc[2] = 0.0;
  local_148.fData.fExtAlloc[3] = 0.0;
  local_148.fData.fExtAlloc[4] = 0.0;
  local_148.fData.fExtAlloc[5] = 0.0;
  local_148.fData.super_TPZVec<double>.fStore = pdVar2;
  dJ2(this,&local_1a0);
  dJ3(this,&local_148);
  local_f0 = &PTR__TPZTensor_0189f0b0;
  TPZVec<double>::TPZVec(&local_e8,0);
  local_e8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0189f470;
  local_e8.fNElements = 6;
  local_e8.fNAlloc = 0;
  adStack_c8[0] = 0.0;
  adStack_c8[1] = 0.0;
  adStack_c8[2] = 0.0;
  adStack_c8[3] = 0.0;
  adStack_c8[4] = 0.0;
  adStack_c8[5] = 0.0;
  local_88 = &PTR__TPZTensor_0189f0b0;
  local_e8.fStore = adStack_c8;
  TPZVec<double>::TPZVec(&local_80,0);
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0189f470;
  local_80.fNElements = 6;
  local_80.fNAlloc = 0;
  adStack_60[0] = 0.0;
  adStack_60[1] = 0.0;
  adStack_60[2] = 0.0;
  adStack_60[3] = 0.0;
  adStack_60[4] = 0.0;
  adStack_60[5] = 0.0;
  __x = dVar4 * dVar4 * dVar4;
  local_80.fStore = adStack_60;
  if (__x < 0.0) {
    uStack_90 = 0;
    adStack_c8[6] = dVar5 * 5.196152422706632;
    dVar6 = sqrt(__x);
    dVar7 = adStack_c8[6];
  }
  else {
    dVar6 = SQRT(__x);
    dVar7 = dVar5 * 5.196152422706632;
  }
  dVar7 = dVar7 / (dVar6 + dVar6);
  dVar7 = (double)(~-(ulong)(-1.0 < dVar7) & (ulong)(dVar7 * 0.999) |
                  (ulong)dVar7 & -(ulong)(-1.0 < dVar7));
  lVar3 = 0;
  do {
    dVar6 = (local_1a0.fData.super_TPZVec<double>.fStore + lVar3)[1];
    local_1a0.fData.super_TPZVec<double>.fStore[lVar3] =
         local_1a0.fData.super_TPZVec<double>.fStore[lVar3] * dVar5 * 3.0;
    (local_1a0.fData.super_TPZVec<double>.fStore + lVar3)[1] = dVar6 * dVar5 * 3.0;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 6);
  lVar3 = 0;
  do {
    dVar6 = (local_148.fData.super_TPZVec<double>.fStore + lVar3)[1];
    local_148.fData.super_TPZVec<double>.fStore[lVar3] =
         local_148.fData.super_TPZVec<double>.fStore[lVar3] * (dVar4 + dVar4);
    (local_148.fData.super_TPZVec<double>.fStore + lVar3)[1] = dVar6 * (dVar4 + dVar4);
    lVar3 = lVar3 + 2;
  } while (lVar3 != 6);
  lVar3 = 0;
  do {
    local_1a0.fData.super_TPZVec<double>.fStore[lVar3] =
         local_1a0.fData.super_TPZVec<double>.fStore[lVar3] -
         local_148.fData.super_TPZVec<double>.fStore[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  dVar5 = (dVar5 * 9.0 * dVar5) / __x;
  dVar4 = __x * dVar4 * dVar4;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar5 = 1.3333333333333333 -
          (double)(~-(ulong)(dVar5 < 1.3333333333333333) & (ulong)(dVar5 * 0.999) |
                  (ulong)dVar5 & -(ulong)(dVar5 < 1.3333333333333333));
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar4 = 1.0 / ((dVar4 + dVar4) * dVar5);
  lVar3 = 0;
  do {
    dVar5 = (local_1a0.fData.super_TPZVec<double>.fStore + lVar3)[1];
    local_1a0.fData.super_TPZVec<double>.fStore[lVar3] =
         local_1a0.fData.super_TPZVec<double>.fStore[lVar3] * dVar4;
    (local_1a0.fData.super_TPZVec<double>.fStore + lVar3)[1] = dVar5 * dVar4;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 6);
  lVar3 = 0;
  do {
    dVar5 = (local_1a0.fData.super_TPZVec<double>.fStore + lVar3)[1];
    local_1a0.fData.super_TPZVec<double>.fStore[lVar3] =
         local_1a0.fData.super_TPZVec<double>.fStore[lVar3] * dVar4;
    (local_1a0.fData.super_TPZVec<double>.fStore + lVar3)[1] = dVar5 * dVar4;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 6);
  dVar4 = acos((double)(~-(ulong)(dVar7 < 1.0) & (ulong)(dVar7 * 0.999) |
                       -(ulong)(dVar7 < 1.0) & (ulong)dVar7));
  dVar4 = dVar4 / 3.0;
  *Lode = (double)(~-(ulong)(dVar4 < 1.0470975511965976) & (ulong)(dVar4 * 0.999) |
                  (ulong)dVar4 & -(ulong)(dVar4 < 1.0470975511965976));
  local_88 = &PTR__TPZTensor_0189f0b0;
  if (local_80.fStore == adStack_60) {
    local_80.fStore = (double *)0x0;
  }
  local_80.fNAlloc = 0;
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_80.fStore != (double *)0x0) {
    operator_delete__(local_80.fStore);
  }
  local_f0 = &PTR__TPZTensor_0189f0b0;
  if (local_e8.fStore == adStack_c8) {
    local_e8.fStore = (double *)0x0;
  }
  local_e8.fNAlloc = 0;
  local_e8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_e8.fStore != (double *)0x0) {
    operator_delete__(local_e8.fStore);
  }
  local_148.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_0189f0b0;
  if (local_148.fData.super_TPZVec<double>.fStore == pdVar2) {
    local_148.fData.super_TPZVec<double>.fStore = (double *)0x0;
  }
  local_148.fData.super_TPZVec<double>.fNAlloc = 0;
  local_148.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_148.fData.super_TPZVec<double>.fStore != (double *)0x0) {
    operator_delete__(local_148.fData.super_TPZVec<double>.fStore);
  }
  local_1a0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_0189f0b0;
  if (local_1a0.fData.super_TPZVec<double>.fStore == pdVar1) {
    local_1a0.fData.super_TPZVec<double>.fStore = (double *)0x0;
  }
  local_1a0.fData.super_TPZVec<double>.fNAlloc = 0;
  local_1a0.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_1a0.fData.super_TPZVec<double>.fStore != (double *)0x0) {
    operator_delete__(local_1a0.fData.super_TPZVec<double>.fStore);
  }
  return;
}

Assistant:

void TPZTensor<T>::Lodeangle(TPZTensor<T> &GradLode, T &Lode)const {
    T J2t(this->J2());
    T J3t(this->J3());

    if (fabs(TPZExtractVal::val(J2t)) < 1.e-6)J2t = T(1.e-6);
    T sqrtJ2t = sqrt(J2t);
    if (fabs(TPZExtractVal::val(sqrtJ2t)) < 1.e-6)sqrtJ2t = T(1.e-6);

    TPZTensor<T> dJ2t, dJ3t;

    this->dJ2(dJ2t);
    this->dJ3(dJ3t);
    // Derivatives with respect to I1, J2 and J3

    TPZTensor<T> dLodeAngle, TempTensor;

    //QUAL DOS DOIS?
    //T theta =-asin( ( T( 3.) * sqrt( T( 3.) ) * J3t ) /( T( 2.) *  sqrt(J2t*J2t*J2t) ) )/T( 3.);
    //O GRADIENTE DO LODE ESTA EM FUNCAO DO LODE DE 0 a Pi/3


    T lodetemp = (T(3.) * sqrt(T(3.)) * J3t) / (T(2.) * sqrt(J2t * J2t * J2t));
    if (TPZExtractVal::val(lodetemp) <= -1.) {
        lodetemp *= T(0.999); //	DebugStop();
        // TPZExtractVal::val(lodetemp) *= T(0.999);	//	DebugStop();
        //lodetemp = T(-1.);

    }


    //cout << "\n lodetemp "<<lodetemp<<endl;
    //cout << "\n TPZExtractVal::val(lodetemp);"<<TPZExtractVal::val(lodetemp)<<endl;

    if (TPZExtractVal::val(lodetemp) >= 1.) {
        lodetemp *= T(0.999);
        // TPZExtractVal::val(lodetemp)*= 0.999;
        // lodetemp = T(1.);
        //DebugStop();
    }

    //DLODE = (-2*Dj3*j2 + 3*Dj2*J3t)/(2.*pow(J2t,2.5)*sqrt(1.3333333333333333 - (9*pow(J3t,2))/pow(J2t,3)))
    //1
    T j33 = T(3.) * J3t;
    dJ2t.Multiply(j33, 1);
    //2
    T j22 = T(2.) * J2t;
    dJ3t.Multiply(j22, 1);
    //3
    dJ2t.Add(dJ3t, -1);
    //4
    //if(TPZExtractVal::val(J2t)<1.e-6)J2t=1.e-6;
    T checknegativeroot = ((T(9.) * J3t * J3t) / (J2t * J2t * J2t));
    if (TPZExtractVal::val(checknegativeroot) >= 4 / 3.)checknegativeroot *= T(0.999);
    T denom = T(2.) * sqrt(J2t * J2t * J2t * J2t * J2t) * sqrt((T(4 / 3.)) - checknegativeroot);
    //T denom2 = (T(2.)*pow(J2t,2.5)*sqrt(T(1.3333333333333333) - (T(9.)*pow(J3t,2.))/pow(J2t,3)));
    T oneoverden = T(1.) / denom;
    dJ2t.Multiply(oneoverden, 1);
    dJ2t *= oneoverden;
    //    GradLode = dJ2t;

    T acoslodetemp = acos(lodetemp);
    Lode = acoslodetemp / T(3.);

    if (TPZExtractVal::val(Lode) >= (M_PI / 3.) - 0.0001) {
        Lode *= T(0.999);
    }
}